

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogGetSystem(xmlChar *sysID)

{
  xmlChar *pxVar1;
  xmlChar *ret;
  xmlChar *sysID_local;
  
  if (xmlCatalogInitialized == 0) {
    xmlInitializeCatalog();
  }
  if (xmlCatalogGetSystem::msg == 0) {
    xmlPrintErrorMessage("Use of deprecated xmlCatalogGetSystem() call\n");
    xmlCatalogGetSystem::msg = xmlCatalogGetSystem::msg + 1;
  }
  if (sysID == (xmlChar *)0x0) {
    sysID_local = (xmlChar *)0x0;
  }
  else if (((xmlDefaultCatalog == (xmlCatalogPtr)0x0) ||
           (pxVar1 = xmlCatalogListXMLResolve(xmlDefaultCatalog->xml,(xmlChar *)0x0,sysID),
           pxVar1 == (xmlChar *)0x0)) || (pxVar1 == (xmlChar *)0xffffffffffffffff)) {
    if (xmlDefaultCatalog == (xmlCatalogPtr)0x0) {
      sysID_local = (xmlChar *)0x0;
    }
    else {
      sysID_local = xmlCatalogGetSGMLSystem(xmlDefaultCatalog->sgml,sysID);
    }
  }
  else {
    snprintf((char *)xmlCatalogGetSystem::result,999,"%s",pxVar1);
    xmlCatalogGetSystem::result[999] = '\0';
    sysID_local = xmlCatalogGetSystem::result;
  }
  return sysID_local;
}

Assistant:

const xmlChar *
xmlCatalogGetSystem(const xmlChar *sysID) {
    xmlChar *ret;
    static xmlChar result[1000];
    static int msg = 0;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    if (msg == 0) {
	xmlPrintErrorMessage(
		"Use of deprecated xmlCatalogGetSystem() call\n");
	msg++;
    }

    if (sysID == NULL)
	return(NULL);

    /*
     * Check first the XML catalogs
     */
    if (xmlDefaultCatalog != NULL) {
	ret = xmlCatalogListXMLResolve(xmlDefaultCatalog->xml, NULL, sysID);
	if ((ret != NULL) && (ret != XML_CATAL_BREAK)) {
	    snprintf((char *) result, sizeof(result) - 1, "%s", (char *) ret);
	    result[sizeof(result) - 1] = 0;
	    return(result);
	}
    }

    if (xmlDefaultCatalog != NULL)
	return(xmlCatalogGetSGMLSystem(xmlDefaultCatalog->sgml, sysID));
    return(NULL);
}